

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void Omega_h::fill<signed_char>(Write<signed_char> *a,char val)

{
  undefined1 local_48 [8];
  type f;
  char val_local;
  Write<signed_char> *a_local;
  LO local_10;
  
  f._23_1_ = val;
  Write<signed_char>::Write((Write<signed_char> *)local_48,a);
  f.a.shared_alloc_.direct_ptr._0_1_ = f._23_1_;
  if (((ulong)(a->shared_alloc_).alloc & 1) == 0) {
    local_10 = (LO)((a->shared_alloc_).alloc)->size;
  }
  else {
    local_10 = (LO)((ulong)(a->shared_alloc_).alloc >> 3);
  }
  parallel_for<Omega_h::fill<signed_char>(Omega_h::Write<signed_char>,signed_char)::_lambda(int)_1_>
            (local_10,(type *)local_48,"Write(size,value)");
  fill<signed_char>(Omega_h::Write<signed_char>,signed_char)::{lambda(int)#1}::~Write
            ((_lambda_int__1_ *)local_48);
  return;
}

Assistant:

void fill(Write<T> a, T val) {
  auto f = OMEGA_H_LAMBDA(LO i) { a[i] = val; };
  parallel_for(a.size(), f, "Write(size,value)");
}